

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O2

int Exa_ManFindFanin(Exa_Man_t_conflict *p,int i,int k)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0xffffffffffffffff;
  iVar3 = 0;
  for (uVar4 = 0; (long)uVar4 < (long)p->nObjs; uVar4 = uVar4 + 1) {
    iVar1 = p->VarMarks[i][(uint)k][uVar4];
    if (iVar1 != 0) {
      iVar1 = sat_solver_var_value(p->pSat,iVar1);
      iVar3 = iVar3 + iVar1;
      uVar2 = uVar2 & 0xffffffff;
      if (iVar1 != 0) {
        uVar2 = uVar4 & 0xffffffff;
      }
    }
  }
  if (iVar3 == 1) {
    return (int)uVar2;
  }
  __assert_fail("Count == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                ,0x280,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
}

Assistant:

static inline int Exa_ManFindFanin( Exa_Man_t * p, int i, int k )
{
    int j, Count = 0, iVar = -1;
    for ( j = 0; j < p->nObjs; j++ )
        if ( p->VarMarks[i][k][j] && sat_solver_var_value(p->pSat, p->VarMarks[i][k][j]) )
        {
            iVar = j;
            Count++;
        }
    assert( Count == 1 );
    return iVar;
}